

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void slang::ast::TypeParameterSymbol::fromSyntax
               (Scope *scope,TypeParameterDeclarationSyntax *syntax,bool isLocal,bool isPort,
               SmallVectorBase<slang::ast::TypeParameterSymbol_*> *results)

{
  bool bVar1;
  TypeAssignmentSyntax *node;
  SourceLocation args_2;
  DeclaredType *this;
  Type *newType;
  DataTypeSyntax *newType_00;
  byte in_CL;
  byte in_DL;
  Scope *in_RSI;
  SourceLocation in_RDI;
  const_iterator cVar2;
  string_view sVar3;
  DiagCode unaff_retaddr;
  TypeParameterSymbol *param;
  SourceLocation loc;
  string_view name;
  TypeAssignmentSyntax *decl;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *__range2;
  ForwardTypeRestriction typeRestriction;
  Compilation *comp;
  iterator_base<const_slang::syntax::TypeAssignmentSyntax_*> *in_stack_ffffffffffffff48;
  DeclaredType *in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  TypeParameterSymbol *in_stack_ffffffffffffff80;
  iterator_base<const_slang::syntax::TypeAssignmentSyntax_*> local_2c;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_2c._4_8_ = Scope::getCompilation((Scope *)in_RDI);
  local_2c.list._0_4_ = None;
  if (in_RSI[1].compilation != (Compilation *)0x0) {
    local_2c.list._0_4_ =
         SemanticFacts::getTypeRestriction((ForwardTypeRestrictionSyntax *)in_RSI[1].compilation);
  }
  slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *)0x103618e);
  cVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *)0x10361a5);
  while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>_>
                           ((self_type *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    node = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>,_false>
           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>,_false>
                        *)0x10361d3);
    sVar3 = parsing::Token::valueText((Token *)in_stack_ffffffffffffff60);
    args_2 = parsing::Token::location(&node->name);
    in_stack_ffffffffffffff48 = &local_2c;
    in_stack_ffffffffffffff80 =
         BumpAllocator::
         emplace<slang::ast::TypeParameterSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool&,bool&,slang::ast::ForwardTypeRestriction&>
                   ((BumpAllocator *)node,(Scope *)sVar3._M_str,
                    (basic_string_view<char,_std::char_traits<char>_> *)sVar3._M_len,
                    (SourceLocation *)args_2,(bool *)in_stack_ffffffffffffff80,
                    (bool *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    (ForwardTypeRestriction *)cVar2.index);
    Symbol::setSyntax(&in_stack_ffffffffffffff80->super_Symbol,&node->super_SyntaxNode);
    if (node->assignment == (EqualsTypeClauseSyntax *)0x0) {
      this = &in_stack_ffffffffffffff80->targetType;
      newType = Compilation::getErrorType((Compilation *)local_2c._4_8_);
      DeclaredType::setType(this,newType);
      if ((local_12 & 1) == 0) {
        in_stack_ffffffffffffff7c = 0xe0006;
        Scope::addDiag(in_RSI,unaff_retaddr,in_RDI);
      }
      else if ((local_11 & 1) != 0) {
        Scope::addDiag(in_RSI,unaff_retaddr,in_RDI);
        in_stack_ffffffffffffff60 = args_2;
      }
    }
    else {
      in_stack_ffffffffffffff50 = &in_stack_ffffffffffffff80->targetType;
      newType_00 = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                             ((not_null<slang::syntax::DataTypeSyntax_*> *)0x1036318);
      DeclaredType::setTypeSyntax(in_stack_ffffffffffffff50,newType_00);
    }
    SmallVectorBase<slang::ast::TypeParameterSymbol_*>::push_back
              ((SmallVectorBase<slang::ast::TypeParameterSymbol_*> *)in_stack_ffffffffffffff50,
               (TypeParameterSymbol **)in_stack_ffffffffffffff48);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>,_false>
                *)in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void TypeParameterSymbol::fromSyntax(const Scope& scope,
                                     const TypeParameterDeclarationSyntax& syntax, bool isLocal,
                                     bool isPort, SmallVectorBase<TypeParameterSymbol*>& results) {
    auto& comp = scope.getCompilation();
    auto typeRestriction = ForwardTypeRestriction::None;
    if (syntax.typeRestriction)
        typeRestriction = SemanticFacts::getTypeRestriction(*syntax.typeRestriction);

    for (auto decl : syntax.declarators) {
        auto name = decl->name.valueText();
        auto loc = decl->name.location();

        auto param = comp.emplace<TypeParameterSymbol>(scope, name, loc, isLocal, isPort,
                                                       typeRestriction);
        param->setSyntax(*decl);

        if (!decl->assignment) {
            param->targetType.setType(comp.getErrorType());
            if (!isPort)
                scope.addDiag(diag::BodyParamNoInitializer, loc);
            else if (isLocal)
                scope.addDiag(diag::LocalParamNoInitializer, loc);
        }
        else {
            param->targetType.setTypeSyntax(*decl->assignment->type);
        }

        results.push_back(param);
    }
}